

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

RTMatrix4x4 * __thiscall RTMatrix4x4::operator=(RTMatrix4x4 *this,RTMatrix4x4 *mat)

{
  int local_28;
  int local_24;
  int col;
  int row;
  RTMatrix4x4 *mat_local;
  RTMatrix4x4 *this_local;
  
  if (this != mat) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
        this->m_data[local_24][local_28] = mat->m_data[local_24][local_28];
      }
    }
  }
  return this;
}

Assistant:

RTMatrix4x4& RTMatrix4x4::operator =(const RTMatrix4x4& mat)
{
    if (this == &mat)
        return *this;

    for (int row = 0; row < 4; row++)
        for (int col = 0; col < 4; col++)
            m_data[row][col] = mat.m_data[row][col];

    return *this;
}